

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

bool r_exec::Input::IsEligibleCause(View *view)

{
  SyncMode SVar1;
  View *view_local;
  
  SVar1 = View::get_sync(view);
  return SVar1 != SYNC_AXIOM && SVar1 != SYNC_ONCE_AXIOM;
}

Assistant:

bool Input::IsEligibleCause(r_exec::View *view)
{
    switch (view->get_sync()) {
    case View::SYNC_AXIOM:
    case View::SYNC_ONCE_AXIOM:
        return false;

    default:
        return true;
    }
}